

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O3

void ungroup_cb(Fl_Widget *param_1,void *param_2)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Fl_Type *this;
  Fl_Type *pFVar3;
  Fl_Type *pFVar4;
  Fl_Type *__filename;
  char *fmt;
  undefined4 extraout_var_00;
  
  for (pFVar4 = Fl_Type::current; pFVar4 != (Fl_Type *)0x0; pFVar4 = pFVar4->parent) {
    iVar2 = (*pFVar4->_vptr_Fl_Type[0x17])(pFVar4);
    if ((iVar2 != 0) && (iVar2 = (*pFVar4->_vptr_Fl_Type[0x1e])(pFVar4), iVar2 == 0)) {
      pFVar4 = pFVar4->parent;
      if ((pFVar4 == (Fl_Type *)0x0) || (pFVar4->level < 1)) break;
      if (pFVar4->level == 1) {
        iVar2 = (*pFVar4->_vptr_Fl_Type[5])(pFVar4);
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"widget_class");
        if (iVar2 == 0) break;
      }
      this = pFVar4->next;
      if (this == (Fl_Type *)0x0) goto LAB_0017cdc1;
      pFVar3 = this;
      goto LAB_0017cd7b;
    }
  }
  fmt = "Please select widgets in a group";
LAB_0017cdd6:
  fl_message(fmt);
  return;
  while( true ) {
    if ((uVar1 == pFVar4->level + 1U) && (pFVar3->selected == '\0')) {
      fmt = "Please select all widgets in group";
      goto LAB_0017cdd6;
    }
    pFVar3 = pFVar3->next;
    if (pFVar3 == (Fl_Type *)0x0) break;
LAB_0017cd7b:
    uVar1 = pFVar3->level;
    __filename = (Fl_Type *)(ulong)uVar1;
    if ((int)uVar1 <= pFVar4->level) break;
  }
  while ((this != (Fl_Type *)0x0 && (pFVar4->level < this->level))) {
    iVar2 = Fl_Type::remove(this,(char *)__filename);
    __filename = pFVar4;
    Fl_Type::insert(this,pFVar4);
    this = (Fl_Type *)CONCAT44(extraout_var_00,iVar2);
  }
LAB_0017cdc1:
  (*pFVar4->_vptr_Fl_Type[2])(pFVar4);
  return;
}

Assistant:

void ungroup_cb(Fl_Widget *, void *) {
  // Find the group:
  Fl_Type *q = Fl_Type::current;
  while (q && (!q->is_widget() || q->is_menu_item())) q = q->parent;
  if (q) q = q->parent;
  if (!q || q->level < 1 || (q->level == 1 && !strcmp(q->type_name(), "widget_class"))) {
    fl_message("Please select widgets in a group");
    return;
  }
  Fl_Type* n;
  for (n = q->next; n && n->level > q->level; n = n->next) {
    if (n->level == q->level+1 && !n->selected) {
      fl_message("Please select all widgets in group");
      return;
    }
  }
  for (n = q->next; n && n->level > q->level;) {
    Fl_Type *nxt = n->remove();
    n->insert(q);
    n = nxt;
  }
  delete q;
}